

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O0

__string_type *
qclab::qasm2<double>
          (__string_type *__return_storage_ptr__,char *type,int qubit0,int qubit1,double angle)

{
  ostream *poVar1;
  qclab *this;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream stream;
  ostream local_1a0 [376];
  double local_28;
  double angle_local;
  int qubit1_local;
  int qubit0_local;
  char *type_local;
  
  local_28 = angle;
  angle_local._0_4_ = qubit1;
  angle_local._4_4_ = qubit0;
  _qubit1_local = type;
  type_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,_qubit1_local);
  this = (qclab *)0x13e13a;
  poVar1 = std::operator<<(poVar1,"(");
  qasm_abi_cxx11_(&local_1e0,this,local_28);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,") q[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,angle_local._4_4_);
  poVar1 = std::operator<<(poVar1,"], q[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,angle_local._0_4_);
  std::operator<<(poVar1,"];\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm2( const char type[] , const int qubit0 , const int qubit1 ,
                     const T angle ) {
    std::stringstream stream ;
    stream << type << "(" << qasm( angle ) << ") q[" << qubit0 << "], q["
                                                     << qubit1 << "];\n" ;
    return stream.str() ;
  }